

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_write(p_ply ply,double value)

{
  bool bVar1;
  int iVar2;
  p_ply_element_conflict ptVar3;
  p_ply_property_conflict ptVar4;
  bool bVar5;
  bool local_3f;
  bool local_3e;
  int spaceafter;
  int breakafter;
  int type;
  p_ply_property_conflict property;
  p_ply_element_conflict element;
  double value_local;
  p_ply ply_local;
  
  if (ply->nelements < ply->welement) {
    return 0;
  }
  ptVar3 = ply->element + ply->welement;
  if (ptVar3->nproperties < ply->wproperty) {
    return 0;
  }
  ptVar4 = ptVar3->property + ply->wproperty;
  if (ptVar4->type == PLY_LIST) {
    if (ply->wvalue_index == 0) {
      spaceafter = ptVar4->length_type;
      ply->wlength = (long)value;
    }
    else {
      spaceafter = ptVar4->value_type;
    }
  }
  else {
    spaceafter = ptVar4->type;
    ply->wlength = 0;
  }
  iVar2 = (*ply->odriver->ohandler[spaceafter])(ply,value);
  if (iVar2 == 0) {
    ply_ferror(ply,"Failed writing %s of %s %d (%s: %s)",ptVar4,ptVar3,ply->winstance_index,
               ply->odriver->name,ply_type_list[spaceafter]);
    return 0;
  }
  ply->wvalue_index = ply->wvalue_index + 1;
  if (ply->wlength < ply->wvalue_index) {
    ply->wvalue_index = 0;
    ply->wproperty = ply->wproperty + 1;
  }
  bVar1 = ptVar3->nproperties <= ply->wproperty;
  if (bVar1) {
    ply->wproperty = 0;
    ply->winstance_index = ply->winstance_index + 1;
  }
  if (ptVar3->ninstances <= ply->winstance_index) {
    ply->winstance_index = 0;
    do {
      ply->welement = ply->welement + 1;
      bVar5 = false;
      if (ply->welement < ply->nelements) {
        bVar5 = ply->element[ply->welement].ninstances == 0;
      }
    } while (bVar5);
  }
  if (ply->storage_mode != PLY_ASCII) {
    return 1;
  }
  if (!bVar1) {
    iVar2 = putc(0x20,(FILE *)ply->fp);
    local_3e = false;
    if (iVar2 < 1) goto LAB_001670b3;
  }
  local_3f = true;
  if (bVar1) {
    iVar2 = putc(10,(FILE *)ply->fp);
    local_3f = 0 < iVar2;
  }
  local_3e = local_3f;
LAB_001670b3:
  return (uint)local_3e;
}

Assistant:

int ply_write(p_ply ply, double value) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    int type = -1;
    int breakafter = 0;
    int spaceafter = 1;
    if (ply->welement > ply->nelements) return 0;
    element = &ply->element[ply->welement];
    if (ply->wproperty > element->nproperties) return 0;
    property = &element->property[ply->wproperty];
    if (property->type == PLY_LIST) {
        if (ply->wvalue_index == 0) {
            type = property->length_type;
            ply->wlength = (long) value;
        } else type = property->value_type;
    } else {
        type = property->type;
        ply->wlength = 0;
    }
    if (!ply->odriver->ohandler[type](ply, value)) {
        ply_ferror(ply, "Failed writing %s of %s %d (%s: %s)",
                    property->name, element->name,
                    ply->winstance_index,
                    ply->odriver->name, ply_type_list[type]);
        return 0;
    }
    ply->wvalue_index++;
    if (ply->wvalue_index > ply->wlength) {
        ply->wvalue_index = 0;
        ply->wproperty++;
    }
    if (ply->wproperty >= element->nproperties) {
        ply->wproperty = 0;
        ply->winstance_index++;
        breakafter = 1;
        spaceafter = 0;
    }
    if (ply->winstance_index >= element->ninstances) {
        ply->winstance_index = 0;
        do {
            ply->welement++;
            element = &ply->element[ply->welement];
        } while (ply->welement < ply->nelements && !element->ninstances);
    }
    if (ply->storage_mode == PLY_ASCII) {
        return (!spaceafter || putc(' ', ply->fp) > 0) &&
               (!breakafter || putc('\n', ply->fp) > 0);
    } else {
        return 1;
    }
}